

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void Catch::loadTestNamesFromFile(ConfigData *config,string *_filename)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  undefined8 uVar4;
  domain_error *this;
  istream *piVar5;
  byte local_322;
  string local_300 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0 [37];
  byte local_2bb;
  byte local_2ba;
  allocator local_2b9;
  string local_2b8 [32];
  Catch local_298 [32];
  string local_278 [8];
  string line;
  string local_250 [48];
  istream local_220 [8];
  ifstream f;
  string *_filename_local;
  ConfigData *config_local;
  
  uVar4 = std::__cxx11::string::c_str();
  std::ifstream::ifstream(local_220,uVar4,8);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) != 0) {
    std::__cxx11::string::string(local_278);
    while( true ) {
      piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_220,local_278);
      bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar5 + *(long *)(*(long *)piVar5 + -0x18)));
      if (!bVar2) break;
      trim(local_298,(string *)local_278);
      std::__cxx11::string::operator=(local_278,(string *)local_298);
      std::__cxx11::string::~string((string *)local_298);
      uVar3 = std::__cxx11::string::empty();
      local_2ba = 0;
      local_2bb = 0;
      local_322 = 0;
      if ((uVar3 & 1) == 0) {
        std::allocator<char>::allocator();
        local_2ba = 1;
        std::__cxx11::string::string(local_2b8,"#",&local_2b9);
        local_2bb = 1;
        bVar2 = startsWith((string *)local_278,(string *)local_2b8);
        local_322 = bVar2 ^ 0xff;
      }
      if ((local_2bb & 1) != 0) {
        std::__cxx11::string::~string(local_2b8);
      }
      if ((local_2ba & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
      }
      if ((local_322 & 1) != 0) {
        std::operator+((char *)local_300,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1e63bc
                      );
        std::operator+(local_2e0,(char *)local_300);
        addTestOrTags(config,local_2e0);
        std::__cxx11::string::~string((string *)local_2e0);
        std::__cxx11::string::~string(local_300);
      }
    }
    std::__cxx11::string::~string(local_278);
    std::ifstream::~ifstream(local_220);
    return;
  }
  this = (domain_error *)__cxa_allocate_exception(0x10);
  std::operator+((char *)local_250,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "Unable to load input file: ");
  std::domain_error::domain_error(this,local_250);
  __cxa_throw(this,&std::domain_error::typeinfo,std::domain_error::~domain_error);
}

Assistant:

inline void loadTestNamesFromFile( ConfigData& config, std::string const& _filename ) {
        std::ifstream f( _filename.c_str() );
        if( !f.is_open() )
            throw std::domain_error( "Unable to load input file: " + _filename );

        std::string line;
        while( std::getline( f, line ) ) {
            line = trim(line);
            if( !line.empty() && !startsWith( line, "#" ) )
                addTestOrTags( config, "\"" + line + "\"," );
        }
    }